

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

example * CB_EXPLORE_ADF::test_adf_sequence(multi_ex *ec_seq)

{
  bool bVar1;
  size_type sVar2;
  char *pfile;
  reference ppeVar3;
  size_t sVar4;
  string *pmessage;
  cb_class *pcVar5;
  ostream *poVar6;
  undefined8 uVar7;
  vector<example_*,_std::allocator<example_*>_> *in_RDI;
  stringstream __msg_3;
  stringstream __msg_2;
  stringstream __msg_1;
  example *ec;
  size_t k;
  example *ret;
  uint32_t count;
  stringstream __msg;
  example *in_stack_fffffffffffff8f8;
  undefined8 in_stack_fffffffffffff900;
  int iVar9;
  ulong uVar8;
  char *in_stack_fffffffffffff908;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  undefined1 uVar10;
  stringstream local_6c8 [16];
  ostream local_6b8;
  undefined1 local_539;
  stringstream local_518 [16];
  ostream local_508;
  undefined1 local_389;
  stringstream local_368 [16];
  ostream local_358;
  value_type local_1e0;
  ulong local_1d8;
  value_type local_1d0;
  uint local_1c8;
  undefined1 local_1c1;
  stringstream local_190 [16];
  ostream local_180;
  vector<example_*,_std::allocator<example_*>_> *local_8;
  
  iVar9 = (int)((ulong)in_stack_fffffffffffff900 >> 0x20);
  local_8 = in_RDI;
  sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDI);
  if (sVar2 == 0) {
    std::__cxx11::stringstream::stringstream(local_190);
    std::operator<<(&local_180,
                    "cb_adf: At least one action must be provided for an example to be valid.");
    local_1c1 = 1;
    pfile = (char *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              ((vw_exception *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),pfile,
               iVar9,(string *)in_stack_fffffffffffff8f8);
    local_1c1 = 0;
    __cxa_throw(pfile,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_1c8 = 0;
  local_1d0 = (value_type)0x0;
  local_1d8 = 0;
  while( true ) {
    uVar8 = local_1d8;
    sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(local_8);
    if (sVar2 <= uVar8) {
      if (local_1c8 < 2) {
        return local_1d0;
      }
      std::__cxx11::stringstream::stringstream(local_6c8);
      iVar9 = (int)(uVar8 >> 0x20);
      std::operator<<(&local_6b8,"cb_adf: badly formatted example, only one line can have a cost");
      uVar10 = 1;
      uVar7 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                ((vw_exception *)CONCAT17(uVar10,in_stack_fffffffffffff910),
                 in_stack_fffffffffffff908,iVar9,(string *)in_stack_fffffffffffff8f8);
      __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_8,local_1d8);
    iVar9 = (int)(uVar8 >> 0x20);
    local_1e0 = *ppeVar3;
    sVar4 = v_array<CB::cb_class>::size((v_array<CB::cb_class> *)&(local_1e0->l).simple);
    if (1 < sVar4) break;
    sVar4 = v_array<CB::cb_class>::size((v_array<CB::cb_class> *)&(local_1e0->l).simple);
    if (sVar4 == 1) {
      pcVar5 = v_array<CB::cb_class>::operator[]((v_array<CB::cb_class> *)&(local_1e0->l).simple,0);
      if ((pcVar5->cost != 3.4028235e+38) || (NAN(pcVar5->cost))) {
        local_1d0 = local_1e0;
        local_1c8 = local_1c8 + 1;
      }
    }
    bVar1 = CB::ec_is_example_header(in_stack_fffffffffffff8f8);
    if ((bVar1) && (local_1d8 != 0)) {
      std::__cxx11::stringstream::stringstream(local_518);
      poVar6 = std::operator<<(&local_508,"warning: example headers at position ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1d8);
      std::operator<<(poVar6,": can only have in initial position!");
      local_539 = 1;
      uVar7 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                ((vw_exception *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                 in_stack_fffffffffffff908,iVar9,(string *)in_stack_fffffffffffff8f8);
      local_539 = 0;
      __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_1d8 = local_1d8 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_368);
  std::operator<<(&local_358,"cb_adf: badly formatted example, only one cost can be known.");
  local_389 = 1;
  pmessage = (string *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            ((vw_exception *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
             in_stack_fffffffffffff908,iVar9,pmessage);
  local_389 = 0;
  __cxa_throw(pmessage,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

example* test_adf_sequence(multi_ex& ec_seq)
{
  if (ec_seq.size() == 0)
    THROW("cb_adf: At least one action must be provided for an example to be valid.");

  uint32_t count = 0;
  example* ret = nullptr;
  for (size_t k = 0; k < ec_seq.size(); k++)
  {
    example* ec = ec_seq[k];

    // Check if there is more than one cost for this example.
    if (ec->l.cb.costs.size() > 1)
      THROW("cb_adf: badly formatted example, only one cost can be known.");

    // Check whether the cost was initialized to a value.
    if (ec->l.cb.costs.size() == 1 && ec->l.cb.costs[0].cost != FLT_MAX)
    {
      ret = ec;
      count += 1;
    }

    // Check whether the current line is a shared features example and not in the first position.
    if (CB::ec_is_example_header(*ec) && (k != 0))
      THROW("warning: example headers at position " << k << ": can only have in initial position!");
  }

  if (count > 1)
    THROW("cb_adf: badly formatted example, only one line can have a cost");

  return ret;
}